

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

void __thiscall
httplib::Response::set_content_provider
          (Response *this,string *content_type,ContentProviderWithoutLength *provider,
          ContentProviderResourceReleaser *resource_releaser)

{
  char cVar1;
  undefined8 uVar2;
  char *pcVar3;
  _Any_data local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  local_48._M_unused._M_object = &local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Content-Type","");
  cVar1 = (char)*local_48._M_unused._M_function_pointer;
  uVar2 = local_48._M_unused._0_8_;
  while (((cVar1 != '\0' && (uVar2 = uVar2 + 1, cVar1 != '\n')) && (cVar1 != '\r'))) {
    cVar1 = *(char *)uVar2;
  }
  if (cVar1 == '\0') {
    pcVar3 = (content_type->_M_dataplus)._M_p;
    cVar1 = *pcVar3;
    while (((cVar1 != '\0' && (pcVar3 = pcVar3 + 1, cVar1 != '\n')) && (cVar1 != '\r'))) {
      cVar1 = *pcVar3;
    }
    if (cVar1 == '\0') {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&this->headers,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48,
                 content_type);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_unused._0_8_ != &local_38) {
    operator_delete(local_48._M_unused._M_object,(ulong)(local_38._M_allocated_capacity + 1));
  }
  this->content_length_ = 0;
  std::function<bool_(unsigned_long,_httplib::DataSink_&)>::function
            ((function<bool_(unsigned_long,_httplib::DataSink_&)> *)&local_48,provider);
  std::function<bool(unsigned_long,unsigned_long,httplib::DataSink&)>::operator=
            ((function<bool(unsigned_long,unsigned_long,httplib::DataSink&)> *)
             &this->content_provider_,(ContentProviderAdapter *)&local_48);
  if ((code *)local_38._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_38._M_allocated_capacity)(&local_48,&local_48,3);
  }
  std::function<void_(bool)>::operator=
            (&this->content_provider_resource_releaser_,resource_releaser);
  this->is_chunked_content_provider_ = false;
  return;
}

Assistant:

inline void Response::set_content_provider(
    const std::string &content_type, ContentProviderWithoutLength provider,
    ContentProviderResourceReleaser resource_releaser) {
  set_header("Content-Type", content_type);
  content_length_ = 0;
  content_provider_ = detail::ContentProviderAdapter(std::move(provider));
  content_provider_resource_releaser_ = resource_releaser;
  is_chunked_content_provider_ = false;
}